

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uname.cpp
# Opt level: O0

int fs_is_wsl(void)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  int iVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1d8;
  char *local_1c8;
  char *local_1c0;
  undefined1 local_1b8 [8];
  string_view r;
  string_view s;
  utsname buf;
  
  iVar2 = uname((utsname *)((long)&s._M_str + 6));
  if (iVar2 == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&r._M_str,
               (char *)((long)&s._M_str + 6));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_1b8,buf.nodename + 0x39);
    local_1c8 = r._M_str;
    local_1c0 = (char *)s._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"Linux");
    __x._M_str = local_1c0;
    __x._M_len = (size_t)local_1c8;
    bVar1 = std::operator!=(__x,local_1d8);
    if (bVar1) {
      buf.domainname[0x39] = '\0';
      buf.domainname[0x3a] = '\0';
      buf.domainname[0x3b] = '\0';
      buf.domainname[0x3c] = '\0';
    }
    else {
      buf.domainname[0x39] = '\0';
      buf.domainname[0x3a] = '\0';
      buf.domainname[0x3b] = '\0';
      buf.domainname[0x3c] = '\0';
    }
  }
  else {
    buf.domainname[0x39] = -1;
    buf.domainname[0x3a] = -1;
    buf.domainname[0x3b] = -1;
    buf.domainname[0x3c] = -1;
  }
  iVar2._0_1_ = buf.domainname[0x39];
  iVar2._1_1_ = buf.domainname[0x3a];
  iVar2._2_1_ = buf.domainname[0x3b];
  iVar2._3_1_ = buf.domainname[0x3c];
  return iVar2;
}

Assistant:

int fs_is_wsl()
{

#ifdef HAVE_UTSNAME
  struct utsname buf;
  if (uname(&buf) != 0)
    return -1;

  std::string_view s(buf.sysname);
  std::string_view r(buf.release);

  if(s != "Linux")
    return 0;
#ifdef __cpp_lib_starts_ends_with // C++20
  if (r.ends_with("microsoft-standard-WSL2"))
    return 2;
  if (r.ends_with("-Microsoft"))
    return 1;
#endif
#endif
  return 0;
}